

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O1

void __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Function::~Dynamic_Object_Function
          (Dynamic_Object_Function *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Type_Info *pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar3;
  pointer pTVar4;
  
  pTVar2 = (this->m_ti)._M_t.
           super___uniq_ptr_impl<chaiscript::Type_Info,_std::default_delete<chaiscript::Type_Info>_>
           ._M_t.
           super__Tuple_impl<0UL,_chaiscript::Type_Info_*,_std::default_delete<chaiscript::Type_Info>_>
           .super__Head_base<0UL,_chaiscript::Type_Info_*,_false>._M_head_impl;
  if (pTVar2 != (Type_Info *)0x0) {
    operator_delete(pTVar2,0x18);
  }
  (this->m_ti)._M_t.
  super___uniq_ptr_impl<chaiscript::Type_Info,_std::default_delete<chaiscript::Type_Info>_>._M_t.
  super__Tuple_impl<0UL,_chaiscript::Type_Info_*,_std::default_delete<chaiscript::Type_Info>_>.
  super__Head_base<0UL,_chaiscript::Type_Info_*,_false>._M_head_impl = (Type_Info *)0x0;
  this_00 = (this->m_func).
            super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pcVar3 = (this->m_type_name)._M_dataplus._M_p;
  paVar1 = &(this->m_type_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Base_002377f0;
  pTVar4 = (this->super_Proxy_Function_Base).m_types.
           super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pTVar4 != (pointer)0x0) {
    operator_delete(pTVar4,(long)(this->super_Proxy_Function_Base).m_types.
                                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar4);
  }
  operator_delete(this,0x80);
  return;
}

Assistant:

Dynamic_Object_Function(std::string t_type_name, const Proxy_Function &t_func, bool t_is_attribute = false)
            : Proxy_Function_Base(t_func->get_param_types(), t_func->get_arity())
            , m_type_name(std::move(t_type_name))
            , m_func(t_func)
            , m_doti(user_type<Dynamic_Object>())
            , m_is_attribute(t_is_attribute) {
          assert((t_func->get_arity() > 0 || t_func->get_arity() < 0)
                 && "Programming error, Dynamic_Object_Function must have at least one parameter (this)");
        }